

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O1

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp:294:72)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_object_object_cpp:294:72)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  uint uVar1;
  value *v;
  long *plVar2;
  uint *puVar3;
  pointer v_00;
  object_ptr o;
  gc_heap_ptr_untyped gStack_58;
  undefined1 local_48 [32];
  
  v = (value *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
  global_object::validate_object((global_object *)local_48,v);
  plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_48);
  v_00 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
         super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)v_00) >> 3) *
      -0x33333333 < 1) {
    v_00 = (pointer)&value::undefined;
  }
  to_string((mjs *)&gStack_58,(gc_heap *)local_48._0_8_,v_00);
  puVar3 = (uint *)gc_heap_ptr_untyped::get(&gStack_58);
  local_48._24_8_ = puVar3 + 1;
  local_48._16_8_ = ZEXT48(*puVar3);
  uVar1 = (**(code **)(*plVar2 + 0x30))(plVar2);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&gStack_58);
  if (uVar1 < 0x11) {
    __return_storage_ptr__->type_ = boolean;
    (__return_storage_ptr__->field_1).b_ = (uVar1 & 2) == 0 && uVar1 != 0x10;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_48);
    return __return_storage_ptr__;
  }
  __assert_fail("static_cast<unsigned>(a) <= static_cast<unsigned>(property_attribute::invalid)",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/property_attribute.h"
                ,0x24,"bool mjs::is_valid(property_attribute)");
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }